

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KktCheck.cpp
# Opt level: O0

void __thiscall KktCheck::chPrimalFeas(KktCheck *this)

{
  double dVar1;
  int iVar2;
  bool bVar3;
  reference pvVar4;
  reference pvVar5;
  ostream *poVar6;
  long in_RDI;
  vector<double,_std::allocator<double>_> *pvVar7;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double rowV;
  bool istrue;
  double local_18;
  
  bVar3 = true;
  *(undefined4 *)(in_RDI + 0x110) = 0;
  while (*(int *)(in_RDI + 0x110) < *(int *)(in_RDI + 4)) {
    local_18 = 0.0;
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 200),
                        (long)*(int *)(in_RDI + 0x110));
    *(value_type *)(in_RDI + 0x118) = *pvVar4;
    while (iVar2 = *(int *)(in_RDI + 0x118),
          pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)(in_RDI + 200),
                              (long)(*(int *)(in_RDI + 0x110) + 1)), iVar2 < *pvVar4) {
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xe0),
                          (long)*(int *)(in_RDI + 0x118));
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x168),(long)*pvVar4)
      ;
      dVar1 = *pvVar5;
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0xf8),
                          (long)*(int *)(in_RDI + 0x118));
      local_18 = dVar1 * *pvVar5 + local_18;
      *(int *)(in_RDI + 0x118) = *(int *)(in_RDI + 0x118) + 1;
    }
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x98),
                        (long)*(int *)(in_RDI + 0x110));
    if (local_18 - *pvVar5 < 0.0) {
      pvVar7 = (vector<double,_std::allocator<double>_> *)(in_RDI + 0x98);
      std::vector<double,_std::allocator<double>_>::operator[]
                (pvVar7,(long)*(int *)(in_RDI + 0x110));
      std::abs((int)pvVar7);
      if (*(double *)(in_RDI + 0x120) <= extraout_XMM0_Qa &&
          extraout_XMM0_Qa != *(double *)(in_RDI + 0x120)) {
        if (*(int *)(in_RDI + 0x160) == 1) {
          poVar6 = std::operator<<((ostream *)&std::cout,"Row ");
          pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x130),
                              (long)*(int *)(in_RDI + 0x110));
          poVar6 = (ostream *)std::ostream::operator<<(poVar6,*pvVar4);
          poVar6 = std::operator<<(poVar6," infeasible: Row value=");
          poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_18);
          poVar6 = std::operator<<(poVar6,"  L=");
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x98),
                              (long)*(int *)(in_RDI + 0x110));
          poVar6 = (ostream *)std::ostream::operator<<(poVar6,*pvVar5);
          poVar6 = std::operator<<(poVar6,"  U=");
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(in_RDI + 0xb0),
                              (long)*(int *)(in_RDI + 0x110));
          poVar6 = (ostream *)std::ostream::operator<<(poVar6,*pvVar5);
          std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        }
        bVar3 = false;
      }
    }
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0xb0),
                        (long)*(int *)(in_RDI + 0x110));
    if (0.0 < local_18 - *pvVar5) {
      pvVar7 = (vector<double,_std::allocator<double>_> *)(in_RDI + 0xb0);
      std::vector<double,_std::allocator<double>_>::operator[]
                (pvVar7,(long)*(int *)(in_RDI + 0x110));
      std::abs((int)pvVar7);
      if (*(double *)(in_RDI + 0x120) <= extraout_XMM0_Qa_00 &&
          extraout_XMM0_Qa_00 != *(double *)(in_RDI + 0x120)) {
        if (*(int *)(in_RDI + 0x160) == 1) {
          poVar6 = std::operator<<((ostream *)&std::cout,"Row ");
          pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x130),
                              (long)*(int *)(in_RDI + 0x110));
          poVar6 = (ostream *)std::ostream::operator<<(poVar6,*pvVar4);
          poVar6 = std::operator<<(poVar6," infeasible: Row value=");
          poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_18);
          poVar6 = std::operator<<(poVar6,"  L=");
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x98),
                              (long)*(int *)(in_RDI + 0x110));
          poVar6 = (ostream *)std::ostream::operator<<(poVar6,*pvVar5);
          poVar6 = std::operator<<(poVar6,"  U=");
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(in_RDI + 0xb0),
                              (long)*(int *)(in_RDI + 0x110));
          poVar6 = (ostream *)std::ostream::operator<<(poVar6,*pvVar5);
          std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        }
        bVar3 = false;
      }
    }
    *(int *)(in_RDI + 0x110) = *(int *)(in_RDI + 0x110) + 1;
  }
  if (bVar3) {
    if (*(int *)(in_RDI + 0x160) == 1) {
      std::operator<<((ostream *)&std::cout,"Primal feasible.\n");
    }
  }
  else {
    if (*(int *)(in_RDI + 0x160) == 1) {
      std::operator<<((ostream *)&std::cout,"KKT check error: Primal infeasible.\n");
    }
    *(undefined1 *)(in_RDI + 0x128) = 1;
  }
  return;
}

Assistant:

void KktCheck::chPrimalFeas() {
	bool istrue = true;
	double rowV;
	//Ax = b
	for (i=0; i<numRow;i++) {
		rowV = 0;
		for (k=ARstart[i]; k<ARstart[i+1]; k++) 
			rowV = rowV + colValue[ARindex[k]]*ARvalue[k];

		if ( ((rowV-rowLower[i]) < 0) && (abs(rowV-rowLower[i]) > tol)) {
			if (print == 1) 
				cout<<"Row "<<rIndexRev[i]<<" infeasible: Row value="<<rowV<<"  L="<<rowLower[i]<<"  U="<<rowUpper[i]<<endl;
				//cout<<"Row "<<i<<" infeasible: Row value="<<rowV<<"  L="<<rowLower[i]<<"  U="<<rowUpper[i]<<endl;
			istrue = false;
		}

		if ( ((rowV-rowUpper[i]) > 0) && (abs(rowV-rowUpper[i]) > tol)) {
					if (print == 1)
						cout<<"Row "<<rIndexRev[i]<<" infeasible: Row value="<<rowV<<"  L="<<rowLower[i]<<"  U="<<rowUpper[i]<<endl;
						//cout<<"Row "<<i<<" infeasible: Row value="<<rowV<<"  L="<<rowLower[i]<<"  U="<<rowUpper[i]<<endl;
					istrue = false;
				}
	}
	
	if (istrue) {
		if (print == 1) 
			cout<<"Primal feasible.\n";
	}
	else {
		if (print == 1) 
			cout<<"KKT check error: Primal infeasible.\n";
		istrueGlb = true;
	}

}